

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

String * __thiscall kj::_::TraceBuilder::toString(String *__return_storage_ptr__,TraceBuilder *this)

{
  ArrayPtr<void_*const> trace;
  ArrayPtr<void_*const> in_stack_00000000;
  size_t in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  undefined8 *local_68;
  long local_58;
  long lStack_50;
  undefined8 *local_48;
  _ local_38 [8];
  ArrayPtr<const_char> *local_30;
  ArrayPtr<const_char> local_28;
  
  trace.size_ = in_stack_ffffffffffffff88;
  trace.ptr = (void **)0x457fdc;
  stringifyStackTraceAddresses(trace);
  stringifyStackTrace(in_stack_00000000);
  local_30 = (ArrayPtr<const_char> *)(lStack_50 + -1);
  if (lStack_50 == 0) {
    local_30 = (ArrayPtr<const_char> *)0x0;
  }
  local_28.size_ = (size_t)(in_stack_ffffffffffffff90 + -1);
  if (in_stack_ffffffffffffff90 == 0) {
    local_28.size_ = (size_t)(ArrayPtr<const_char> *)0x0;
  }
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,local_38,&local_28,(ArrayPtr<const_char> *)local_28.size_);
  if (in_stack_ffffffffffffff88 != 0) {
    (**(code **)*local_68)
              (local_68,in_stack_ffffffffffffff88,1,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff90,0,0,0);
  }
  if (local_58 != 0) {
    (**(code **)*local_48)(local_48,local_58,1,lStack_50,lStack_50,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String TraceBuilder::toString() {
  auto result = finish();
  return kj::str(stringifyStackTraceAddresses(result),
                 stringifyStackTrace(result));
}